

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O2

void host_server(ENetHost *server)

{
  ushort uVar1;
  unsigned_long_long uVar2;
  int iVar3;
  char *__format;
  ENetEvent event;
  
switchD_00107806_default:
  iVar3 = enet_host_service(server,&event,2);
  if (iVar3 < 1) {
    return;
  }
  switch(event.type) {
  case ENET_EVENT_TYPE_CONNECT:
    printf("A new peer with ID %u connected from ::1:%u.\n",(ulong)(event.peer)->incomingPeerID,
           (ulong)((event.peer)->address).port);
    uVar2 = g_counter + 1;
    (event.peer)->data = (void *)g_counter;
    g_counter = uVar2;
    goto switchD_00107806_default;
  case ENET_EVENT_TYPE_DISCONNECT:
    uVar1 = (event.peer)->incomingPeerID;
    __format = "Peer with ID %u disconnected.\n";
    break;
  case ENET_EVENT_TYPE_RECEIVE:
    printf("A packet of length %zu containing %s was received from %s on channel %u.\n",
           (event.packet)->dataLength,(event.packet)->data,(event.peer)->data,(ulong)event.channelID
          );
    enet_packet_destroy(event.packet);
    goto switchD_00107806_default;
  case ENET_EVENT_TYPE_DISCONNECT_TIMEOUT:
    uVar1 = (event.peer)->incomingPeerID;
    __format = "Client %u timeout.\n";
    break;
  default:
    goto switchD_00107806_default;
  }
  printf(__format,(ulong)uVar1);
  g_disconnected = g_disconnected + 1;
  (event.peer)->data = (void *)0x0;
  goto switchD_00107806_default;
}

Assistant:

void host_server(ENetHost *server) {
    ENetEvent event;
    while (enet_host_service(server, &event, 2) > 0) {
        switch (event.type) {
            case ENET_EVENT_TYPE_CONNECT:
                printf("A new peer with ID %u connected from ::1:%u.\n", event.peer->incomingPeerID , event.peer->address.port);
                /* Store any relevant client information here. */
                event.peer->data = (void*)(g_counter++);
                break;
            case ENET_EVENT_TYPE_RECEIVE:
                printf("A packet of length %zu containing %s was received from %s on channel %u.\n",
                        event.packet->dataLength,
                        event.packet->data,
                        (char *)event.peer->data,
                        event.channelID);

                /* Clean up the packet now that we're done using it. */
                enet_packet_destroy (event.packet);
                break;

            case ENET_EVENT_TYPE_DISCONNECT:
                printf ("Peer with ID %u disconnected.\n", event.peer->incomingPeerID);
                g_disconnected++;
                /* Reset the peer's client information. */
                event.peer->data = NULL;
                break;

            case ENET_EVENT_TYPE_DISCONNECT_TIMEOUT:
                printf ("Client %u timeout.\n", event.peer->incomingPeerID);
                g_disconnected++;
                /* Reset the peer's client information. */
                event.peer->data = NULL;
                break;

            case ENET_EVENT_TYPE_NONE: break;
        }
    }
}